

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_ffh_tostring(lua_State *L)

{
  uint uVar1;
  cTValue *o;
  char *pcVar2;
  TValue *pTVar3;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar4;
  cTValue *pcVar5;
  size_t lenx;
  void *pvVar7;
  ulong uVar8;
  char buf [32];
  char acStack_38 [32];
  GCstr *pGVar6;
  
  o = L->base;
  if (L->top <= o) {
    lj_err_arg(L,1,LJ_ERR_NOVAL);
  }
  L->top = o + 1;
  pcVar5 = lj_meta_lookup(L,o,MM_tostring);
  if ((pcVar5->field_2).it != 0xffffffff) {
    o[-1] = *pcVar5;
    return -1;
  }
  uVar1 = (o->field_2).it;
  if (uVar1 < 0xffff0000) {
    lenx = lj_str_bufnum(acStack_38,o);
    pGVar6 = lj_str_new(L,acStack_38,lenx);
    aVar4.i = (int32_t)pGVar6;
    goto LAB_00141f60;
  }
  if (0xfffffffc < uVar1) {
    aVar4 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
             ((ulong)o[-1].u32.lo + 0x20 + (ulong)~uVar1 * 8);
    goto LAB_00141f60;
  }
  if (uVar1 == 0xfffffff7) {
    if (*(byte *)((ulong)(o->u32).lo + 6) < 2) {
LAB_00141f25:
      uVar8 = (ulong)~uVar1;
      goto LAB_00141f2a;
    }
    lua_pushfstring(L,"function: builtin#%d");
  }
  else {
    uVar8 = 3;
    if ((uVar1 & 0xffff8000) != 0xffff0000) goto LAB_00141f25;
LAB_00141f2a:
    pcVar2 = lj_obj_itypename[uVar8];
    pvVar7 = lua_topointer(L,1);
    lua_pushfstring(L,"%s: %p",pcVar2,pvVar7);
  }
  aVar4 = L->top[-1].field_2.field_0;
LAB_00141f60:
  pTVar3 = L->base;
  pTVar3[-1].u32.lo = (uint32_t)aVar4;
  *(undefined4 *)((long)pTVar3 + -4) = 0xfffffffb;
  return 2;
}

Assistant:

LJLIB_ASM(tostring)		LJLIB_REC(.)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo;
  L->top = o+1;  /* Only keep one argument. */
  if (!tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
    copyTV(L, L->base-1, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  } else {
    GCstr *s;
    if (tvisnumber(o)) {
      s = lj_str_fromnumber(L, o);
    } else if (tvispri(o)) {
      s = strV(lj_lib_upvalue(L, -(int32_t)itype(o)));
    } else {
      if (tvisfunc(o) && isffunc(funcV(o)))
	lua_pushfstring(L, "function: builtin#%d", funcV(o)->c.ffid);
      else
	lua_pushfstring(L, "%s: %p", lj_typename(o), lua_topointer(L, 1));
      /* Note: lua_pushfstring calls the GC which may invalidate o. */
      s = strV(L->top-1);
    }
    setstrV(L, L->base-1, s);
    return FFH_RES(1);
  }
}